

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerSettings.cpp
# Opt level: O2

void __thiscall HdmiCecAnalyzerSettings::HdmiCecAnalyzerSettings(HdmiCecAnalyzerSettings *this)

{
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_00;
  AnalyzerSettingInterfaceChannel *pAVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__HdmiCecAnalyzerSettings_0010cd78;
  uVar3 = 0xffffffffffffffff;
  Channel::Channel(&this->mCecChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_00 = &this->mCecChannelInterface;
  (this->mCecChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_00,pAVar1);
  pAVar1 = this_00->_M_ptr;
  pcVar2 = HdmiCec::GetChannelName();
  HdmiCec::GetFullProtocolName();
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar1,pcVar2);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_00->_M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar4 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar4,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  pcVar2 = HdmiCec::GetProtocolName();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mCecChannel,SUB81(pcVar2,0));
  return;
}

Assistant:

HdmiCecAnalyzerSettings::HdmiCecAnalyzerSettings() : mCecChannel( UNDEFINED_CHANNEL )
{
    mCecChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mCecChannelInterface->SetTitleAndTooltip( HdmiCec::GetChannelName(), HdmiCec::GetFullProtocolName() );
    mCecChannelInterface->SetChannel( mCecChannel );

    AddInterface( mCecChannelInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mCecChannel, HdmiCec::GetProtocolName(), false );
}